

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  void **ppvVar1;
  uint *puVar2;
  uint uVar3;
  uv_stdio_container_t *puVar4;
  long lVar5;
  uv_stream_t *stream;
  int iVar6;
  __pid_t _Var7;
  int (*pipes) [2];
  ulong uVar8;
  long *plVar9;
  int *piVar10;
  long lVar11;
  uint uVar12;
  int (*fds) [2];
  long lVar13;
  ulong uVar14;
  int signal_pipe [2];
  int exec_errorno;
  uv_process_t *local_48;
  uv_loop_t *local_40;
  void **local_38;
  
  signal_pipe[0] = -1;
  signal_pipe[1] = -1;
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL","src/unix/process.c",0x16a,
                  "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0x1f < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,"src/unix/process.c",0x16f,
                  "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 0x2000;
  process->handle_queue[0] = loop->handle_queue;
  plVar9 = (long *)loop->handle_queue[1];
  process->handle_queue[1] = plVar9;
  *plVar9 = (long)process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  ppvVar1 = process->queue;
  process->queue[0] = ppvVar1;
  process->queue[1] = ppvVar1;
  uVar12 = options->stdio_count;
  uVar14 = 3;
  if (3 < (int)uVar12) {
    uVar14 = (ulong)uVar12;
  }
  pipes = (int (*) [2])malloc(uVar14 * 8);
  if (pipes == (int (*) [2])0x0) {
    return -0xc;
  }
  for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
    pipes[uVar8] = (int  [2])0xffffffffffffffff;
  }
  lVar11 = 8;
  fds = pipes;
  local_48 = process;
  local_40 = loop;
  local_38 = ppvVar1;
  for (lVar13 = 0; lVar13 < (int)uVar12; lVar13 = lVar13 + 1) {
    puVar4 = options->stdio;
    uVar3 = *(uint *)((long)puVar4 + lVar11 + -8);
    switch(uVar3 & 7) {
    case 0:
      break;
    case 1:
      lVar5 = *(long *)((long)&puVar4->flags + lVar11);
      if (lVar5 == 0) {
        __assert_fail("container->data.stream != NULL","src/unix/process.c",0xca,
                      "int uv__process_init_stdio(uv_stdio_container_t *, int *)");
      }
      if (*(int *)(lVar5 + 0x18) != 7) {
        iVar6 = -0x16;
        goto LAB_0010d472;
      }
      iVar6 = uv__make_socketpair(*fds,0);
      if (iVar6 != 0) goto LAB_0010d472;
      uVar12 = options->stdio_count;
      break;
    case 2:
    case 4:
      plVar9 = (long *)((long)&puVar4->flags + lVar11);
      if ((uVar3 & 2) == 0) {
        plVar9 = (long *)(*plVar9 + 0xa0);
      }
      if ((int)*plVar9 == -1) {
        iVar6 = -0x16;
        goto LAB_0010d472;
      }
      (*fds)[1] = (int)*plVar9;
      break;
    default:
      __assert_fail("0 && \"Unexpected flags\"","src/unix/process.c",0xde,
                    "int uv__process_init_stdio(uv_stdio_container_t *, int *)");
    }
    fds = fds + 1;
    lVar11 = lVar11 + 0x10;
  }
  iVar6 = uv__make_pipe(signal_pipe,0);
  if (iVar6 == 0) {
    uv_signal_start(&local_40->child_watcher,uv__chld,0x11);
    _Var7 = fork();
    if (_Var7 != -1) {
      if (_Var7 == 0) {
        uv__process_child_init(options,(int)uVar14,pipes,signal_pipe[1]);
LAB_0010d6bd:
        __assert_fail("pid > 0","src/unix/process.c",0x2d,
                      "QUEUE *uv__process_queue(uv_loop_t *, int)");
      }
      uv__close(signal_pipe[1]);
      local_48->status = 0;
      exec_errorno = 0;
      do {
        uVar8 = read(signal_pipe[0],&exec_errorno,4);
        if (uVar8 != 0xffffffffffffffff) {
          if ((uVar8 & 0xfffffffffffffffb) != 0) goto LAB_0010d43d;
          goto LAB_0010d4c6;
        }
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      if (*piVar10 != 0x20) {
LAB_0010d43d:
        abort();
      }
LAB_0010d4c6:
      uv__close(signal_pipe[0]);
      lVar13 = 0;
      for (lVar11 = 0; lVar11 < options->stdio_count; lVar11 = lVar11 + 1) {
        puVar4 = options->stdio;
        if (((*(byte *)((long)&puVar4->flags + lVar13) & 1) != 0) && (-1 < pipes[lVar11][0])) {
          iVar6 = uv__close(pipes[lVar11][1]);
          if (iVar6 != 0) {
            piVar10 = __errno_location();
            if ((*piVar10 != 4) && (*piVar10 != 0x73)) goto LAB_0010d43d;
          }
          pipes[lVar11][1] = -1;
          uv__nonblock(pipes[lVar11][0],1);
          stream = *(uv_stream_t **)((long)&puVar4->data + lVar13);
          if ((stream->type != UV_NAMED_PIPE) || (iVar6 = 0x60, *(int *)&stream[1].close_cb == 0)) {
            iVar6 = (uint)(lVar13 == 0) * 0x20 + 0x20;
          }
          iVar6 = uv__stream_open(stream,pipes[lVar11][0],iVar6);
          if (iVar6 != 0) goto LAB_0010d609;
        }
        lVar13 = lVar13 + 0x10;
      }
      if (exec_errorno == 0) {
        if (_Var7 < 1) goto LAB_0010d6bd;
        local_48->queue[0] = local_40->process_handles;
        plVar9 = (long *)local_40->process_handles[0][1];
        local_48->queue[1] = plVar9;
        *plVar9 = (long)local_38;
        local_40->process_handles[0][1] = local_38;
        uVar12 = local_48->flags;
        if (((uVar12 >> 0xe & 1) == 0) &&
           (local_48->flags = uVar12 | 0x4000, (uVar12 >> 0xd & 1) != 0)) {
          puVar2 = &local_48->loop->active_handles;
          *puVar2 = *puVar2 + 1;
        }
      }
      local_48->pid = _Var7;
      local_48->exit_cb = options->exit_cb;
      iVar6 = exec_errorno;
      goto LAB_0010d5e8;
    }
    piVar10 = __errno_location();
    iVar6 = -*piVar10;
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
  }
LAB_0010d472:
  lVar11 = 0;
  for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
    if (((long)options->stdio_count <= (long)uVar8) ||
       ((*(byte *)((long)&options->stdio->flags + lVar11) & 6) == 0)) {
      if (pipes[uVar8][0] != -1) {
        close(pipes[uVar8][0]);
      }
      if (pipes[uVar8][1] != -1) {
        close(pipes[uVar8][1]);
      }
    }
    lVar11 = lVar11 + 0x10;
  }
LAB_0010d5e8:
  free(pipes);
  return iVar6;
LAB_0010d609:
  for (; lVar13 != 0; lVar13 = lVar13 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar13) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar13 + -8));
    }
  }
  goto LAB_0010d472;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
  int signal_pipe[2] = { -1, -1 };
  int (*pipes)[2];
  int stdio_count;
  QUEUE* q;
  ssize_t r;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = -ENOMEM;
  pipes = malloc(stdio_count * sizeof(*pipes));
  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

  /* This pipe is used by the parent to wait until
   * the child has called `execve()`. We need this
   * to avoid the following race condition:
   *
   *    if ((pid = fork()) > 0) {
   *      kill(pid, SIGTERM);
   *    }
   *    else if (pid == 0) {
   *      execve("/bin/cat", argp, envp);
   *    }
   *
   * The parent sends a signal immediately after forking.
   * Since the child may not have called `execve()` yet,
   * there is no telling what process receives the signal,
   * our fork or /bin/cat.
   *
   * To avoid ambiguity, we create a pipe with both ends
   * marked close-on-exec. Then, after the call to `fork()`,
   * the parent polls the read end until it EOFs or errors with EPIPE.
   */
  err = uv__make_pipe(signal_pipe, 0);
  if (err)
    goto error;

  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);

  pid = fork();

  if (pid == -1) {
    err = -errno;
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
    goto error;
  }

  if (pid == 0) {
    uv__process_child_init(options, stdio_count, pipes, signal_pipe[1]);
    abort();
  }

  uv__close(signal_pipe[1]);

  process->status = 0;
  exec_errorno = 0;
  do
    r = read(signal_pipe[0], &exec_errorno, sizeof(exec_errorno));
  while (r == -1 && errno == EINTR);

  if (r == 0)
    ; /* okay, EOF */
  else if (r == sizeof(exec_errorno))
    ; /* okay, read errorno */
  else if (r == -1 && errno == EPIPE)
    ; /* okay, got EPIPE */
  else
    abort();

  uv__close(signal_pipe[0]);

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i], i == 0);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  /* Only activate this handle if exec() happened successfully */
  if (exec_errorno == 0) {
    q = uv__process_queue(loop, pid);
    QUEUE_INSERT_TAIL(q, &process->queue);
    uv__handle_start(process);
  }

  process->pid = pid;
  process->exit_cb = options->exit_cb;

  free(pipes);
  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        close(pipes[i][0]);
      if (pipes[i][1] != -1)
        close(pipes[i][1]);
    }
    free(pipes);
  }

  return err;
}